

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llvm-slicer-crit.cpp
# Opt level: O3

bool usesTheVariable(Instruction *I,string *var,bool isglobal,LLVMPointerAnalysis *pta)

{
  ulong uVar1;
  char cVar2;
  int iVar3;
  raw_ostream *prVar4;
  ConstantExpr *CE;
  _Base_ptr p_Var5;
  _Base_ptr p_Var6;
  ConstantExpr CVar7;
  _Base_ptr p_Var8;
  pointer pcVar9;
  ulong uVar10;
  bool bVar11;
  StringRef Str;
  StringRef Str_00;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  pair<bool,_dg::LLVMMemoryRegionSet> memacc;
  Instruction local_68 [8];
  _Rb_tree<llvm::Value_*,_std::pair<llvm::Value_*const,_std::vector<dg::LLVMMemoryRegionSet::OffsetPair,_std::allocator<dg::LLVMMemoryRegionSet::OffsetPair>_>_>,_std::_Select1st<std::pair<llvm::Value_*const,_std::vector<dg::LLVMMemoryRegionSet::OffsetPair,_std::allocator<dg::LLVMMemoryRegionSet::OffsetPair>_>_>_>,_std::less<llvm::Value_*>,_std::allocator<std::pair<llvm::Value_*const,_std::vector<dg::LLVMMemoryRegionSet::OffsetPair,_std::allocator<dg::LLVMMemoryRegionSet::OffsetPair>_>_>_>_>
  local_60 [8];
  _Rb_tree_node_base local_58;
  
  cVar2 = llvm::Instruction::mayReadFromMemory();
  if ((cVar2 != '\0') || (cVar2 = llvm::Instruction::mayWriteToMemory(), cVar2 != '\0')) {
    if (pta != (LLVMPointerAnalysis *)0x0) {
      dg::LLVMPointerAnalysis::getAccessedMemory(local_68);
      if (local_68[0] == (Instruction)0x1) {
        prVar4 = (raw_ostream *)llvm::errs();
        Str.Length = 0x2f;
        Str.Data = "WARNING: matched due to a lack of information: ";
        prVar4 = llvm::raw_ostream::operator<<(prVar4,Str);
        llvm::Value::print((raw_ostream *)I,SUB81(prVar4,0));
        Str_00.Length = 1;
        Str_00.Data = "\n";
        llvm::raw_ostream::operator<<(prVar4,Str_00);
        bVar11 = true;
      }
      else {
        if (local_58._M_left != &local_58) {
          uVar10 = 0;
          p_Var6 = local_58._M_left;
          do {
            uVar1 = *(ulong *)(p_Var6 + 1);
            if (isglobal) {
              if (*(char *)(uVar1 + 0x10) == '\x03') {
LAB_001275a8:
                auVar12 = llvm::Value::getName();
                if (auVar12._8_8_ == var->_M_string_length) {
                  bVar11 = true;
                  if (auVar12._8_8_ != 0) {
                    pcVar9 = (var->_M_dataplus)._M_p;
                    goto LAB_00127620;
                  }
                  goto LAB_00127660;
                }
              }
            }
            else {
              if (*(char *)(uVar1 + 0x10) == '\x03') goto LAB_001275a8;
              bVar11 = true;
              if (valuesToVariables_abi_cxx11_._M_t._M_impl.super__Rb_tree_header._M_header.
                  _M_parent == (_Base_ptr)0x0) goto LAB_00127660;
              p_Var5 = &valuesToVariables_abi_cxx11_._M_t._M_impl.super__Rb_tree_header._M_header;
              p_Var8 = valuesToVariables_abi_cxx11_._M_t._M_impl.super__Rb_tree_header._M_header.
                       _M_parent;
              do {
                if (*(ulong *)(p_Var8 + 1) >= uVar1) {
                  p_Var5 = p_Var8;
                }
                p_Var8 = (&p_Var8->_M_left)[*(ulong *)(p_Var8 + 1) < uVar1];
              } while (p_Var8 != (_Base_ptr)0x0);
              if (((_Rb_tree_header *)p_Var5 ==
                   &valuesToVariables_abi_cxx11_._M_t._M_impl.super__Rb_tree_header) ||
                 (uVar1 < *(ulong *)(p_Var5 + 1))) goto LAB_00127660;
              p_Var8 = p_Var5[1]._M_left;
              if (p_Var8 != (_Base_ptr)var->_M_string_length) goto LAB_00127629;
              if (p_Var8 == (_Base_ptr)0x0) goto LAB_00127660;
              pcVar9 = (var->_M_dataplus)._M_p;
              auVar12._8_8_ = p_Var8;
              auVar12._0_8_ = p_Var5[1]._M_parent;
LAB_00127620:
              bVar11 = true;
              iVar3 = bcmp(auVar12._0_8_,pcVar9,auVar12._8_8_);
              if (iVar3 == 0) goto LAB_00127660;
            }
LAB_00127629:
            uVar10 = uVar10 + 1;
            if ((ulong)((long)p_Var6[1]._M_left - (long)p_Var6[1]._M_parent >> 4) <= uVar10) {
              p_Var6 = (_Base_ptr)std::_Rb_tree_increment(p_Var6);
              uVar10 = 0;
            }
          } while ((uVar10 != 0) || (p_Var6 != &local_58));
        }
        bVar11 = false;
      }
LAB_00127660:
      std::
      _Rb_tree<llvm::Value_*,_std::pair<llvm::Value_*const,_std::vector<dg::LLVMMemoryRegionSet::OffsetPair,_std::allocator<dg::LLVMMemoryRegionSet::OffsetPair>_>_>,_std::_Select1st<std::pair<llvm::Value_*const,_std::vector<dg::LLVMMemoryRegionSet::OffsetPair,_std::allocator<dg::LLVMMemoryRegionSet::OffsetPair>_>_>_>,_std::less<llvm::Value_*>,_std::allocator<std::pair<llvm::Value_*const,_std::vector<dg::LLVMMemoryRegionSet::OffsetPair,_std::allocator<dg::LLVMMemoryRegionSet::OffsetPair>_>_>_>_>
      ::_M_erase(local_60,(_Link_type)local_58._M_parent);
      return bVar11;
    }
    if ((I[0x10] != (Instruction)0x3b) && (I[0x10] != (Instruction)0x3c)) {
      return true;
    }
    CE = (ConstantExpr *)llvm::Value::stripPointerCasts();
    CVar7 = CE[0x10];
    if (CE == (ConstantExpr *)0x0 || CVar7 != (ConstantExpr)0x5) {
      if ((CVar7 != (ConstantExpr)0x3) && (CVar7 != (ConstantExpr)0x3a)) {
        return true;
      }
    }
    else {
      CE = (ConstantExpr *)constExprVar(CE);
      if (CE == (ConstantExpr *)0x0) {
        return true;
      }
      CVar7 = *(ConstantExpr *)((Value *)CE + 0x10);
    }
    if (CVar7 == (ConstantExpr)0x3) {
      auVar13 = llvm::Value::getName();
      if (auVar13._8_8_ != var->_M_string_length) {
        return false;
      }
      if (auVar13._8_8_ == 0) {
        return true;
      }
      pcVar9 = (var->_M_dataplus)._M_p;
    }
    else {
      if (valuesToVariables_abi_cxx11_._M_t._M_impl.super__Rb_tree_header._M_header._M_parent ==
          (_Base_ptr)0x0) {
        return true;
      }
      p_Var8 = &valuesToVariables_abi_cxx11_._M_t._M_impl.super__Rb_tree_header._M_header;
      p_Var6 = valuesToVariables_abi_cxx11_._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
      do {
        if (*(ConstantExpr **)(p_Var6 + 1) >= CE) {
          p_Var8 = p_Var6;
        }
        p_Var6 = (&p_Var6->_M_left)[*(ConstantExpr **)(p_Var6 + 1) < CE];
      } while (p_Var6 != (_Base_ptr)0x0);
      if ((_Rb_tree_header *)p_Var8 ==
          &valuesToVariables_abi_cxx11_._M_t._M_impl.super__Rb_tree_header) {
        return true;
      }
      if (CE < *(ConstantExpr **)(p_Var8 + 1)) {
        return true;
      }
      p_Var6 = p_Var8[1]._M_left;
      if (p_Var6 != (_Base_ptr)var->_M_string_length) {
        return false;
      }
      if (p_Var6 == (_Base_ptr)0x0) {
        return true;
      }
      pcVar9 = (var->_M_dataplus)._M_p;
      auVar13._8_8_ = p_Var6;
      auVar13._0_8_ = p_Var8[1]._M_parent;
    }
    iVar3 = bcmp(auVar13._0_8_,pcVar9,auVar13._8_8_);
    if (iVar3 == 0) {
      return true;
    }
  }
  return false;
}

Assistant:

static bool usesTheVariable(const llvm::Instruction &I, const std::string &var,
                            bool isglobal = false,
                            LLVMPointerAnalysis *pta = nullptr) {
    if (!I.mayReadOrWriteMemory())
        return false;

    if (!pta) {
        // try basic cases that we can decide without PTA
        using namespace llvm;
        const Value *operand = nullptr;
        if (auto *S = dyn_cast<StoreInst>(&I)) {
            auto *A = S->getPointerOperand()->stripPointerCasts();
            if (auto *C = dyn_cast<ConstantExpr>(A)) {
                operand = constExprVar(C);
            } else if ((isa<AllocaInst>(A) || isa<GlobalVariable>(A))) {
                operand = A;
            }
        } else if (auto *L = dyn_cast<LoadInst>(&I)) {
            auto *A = L->getPointerOperand()->stripPointerCasts();
            if (auto *C = dyn_cast<ConstantExpr>(A)) {
                operand = constExprVar(C);
            } else if ((isa<AllocaInst>(A) || isa<GlobalVariable>(A))) {
                operand = A;
            }
        }

        if (operand && !mayBeTheVar(operand, var)) {
            return false;
        }
        return true;
    }

    auto memacc = pta->getAccessedMemory(&I);
    if (memacc.first) {
        // PTA has no information, it may be a definition of the variable,
        // we do not know
        llvm::errs() << "WARNING: matched due to a lack of information: " << I
                     << "\n";
        return true;
    }

    for (const auto &region : memacc.second) {
        if (isglobal &&
            !llvm::isa<llvm::GlobalVariable>(region.pointer.value)) {
            continue;
        }
        if (mayBeTheVar(region.pointer.value, var)) {
            return true;
        }
    }

    return false;
}